

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void do_start_gesture_proc(Am_Object param_1)

{
  Am_Value *pAVar1;
  bool bVar2;
  Am_String local_10;
  
  Am_Object::Set(0x520,0x169,0);
  pAVar1 = (Am_Value *)Am_Object::Get(0x550,0x169);
  Am_String::Am_String(&local_10,pAVar1);
  bVar2 = Am_String::operator!=(&local_10,&training_mode);
  Am_String::~Am_String(&local_10);
  if (bVar2) {
    Am_Object::Set(0x500,0x169,0);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_start_gesture, (Am_Object /*cmd*/))
{
  example_panel.Set(Am_VALUE, 0);

  if (Am_String(mode.Get(Am_VALUE)) != training_mode)
    class_panel.Set(Am_VALUE, 0);
}